

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmitBuffer.cpp
# Opt level: O2

void __thiscall
EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_CriticalSection>
::SetValidCallTarget
          (EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_CriticalSection>
           *this,TEmitBufferAllocation *allocation,void *callTarget,bool isValid)

{
  ThreadContextInfo::SetValidCallTargetForCFG(this->threadContext,callTarget,isValid);
  return;
}

Assistant:

void
EmitBufferManager<TAlloc, TPreReservedAlloc, SyncObject>::SetValidCallTarget(TEmitBufferAllocation* allocation, void* callTarget, bool isValid)
{
#if _M_ARM
    callTarget = (void*)((uintptr_t)callTarget | 0x1); // add the thumb bit back, so we CFG-unregister the actual call target
#endif
    if (!JITManager::GetJITManager()->IsJITServer())
    {
        this->threadContext->SetValidCallTargetForCFG(callTarget, isValid);
    }
#if ENABLE_OOP_NATIVE_CODEGEN
    else if (CONFIG_FLAG(OOPCFGRegistration))
    {
        void* segment = allocation->allocation->IsLargeAllocation()
            ? allocation->allocation->largeObjectAllocation.segment
            : allocation->allocation->page->segment;
        HANDLE fileHandle = nullptr;
        PVOID baseAddress = nullptr;
        bool found = false;
        if (this->allocationHeap.IsPreReservedSegment(segment))
        {
            found = ((SegmentBase<TPreReservedAlloc>*)segment)->GetAllocator()->GetVirtualAllocator()->GetFileInfo(callTarget, &fileHandle, &baseAddress);
        }
        else
        {
            found = ((SegmentBase<TAlloc>*)segment)->GetAllocator()->GetVirtualAllocator()->GetFileInfo(callTarget, &fileHandle, &baseAddress);
        }
        AssertOrFailFast(found);
        this->threadContext->SetValidCallTargetFile(callTarget, fileHandle, baseAddress, isValid);
    }
#endif
}